

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

StringEntry * __thiscall cmELF::GetRunPath(cmELF *this)

{
  bool bVar1;
  FileType FVar2;
  cmELF *this_local;
  
  bVar1 = Valid(this);
  if ((bVar1) &&
     ((FVar2 = cmELFInternal::GetFileType(this->Internal), FVar2 == FileTypeExecutable ||
      (FVar2 = cmELFInternal::GetFileType(this->Internal), FVar2 == FileTypeSharedLibrary)))) {
    this_local = (cmELF *)cmELFInternal::GetRunPath(this->Internal);
  }
  else {
    this_local = (cmELF *)0x0;
  }
  return (StringEntry *)this_local;
}

Assistant:

cmELF::StringEntry const* cmELF::GetRunPath()
{
  if (this->Valid() &&
      (this->Internal->GetFileType() == cmELF::FileTypeExecutable ||
       this->Internal->GetFileType() == cmELF::FileTypeSharedLibrary)) {
    return this->Internal->GetRunPath();
  }
  return CM_NULLPTR;
}